

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.cpp
# Opt level: O3

void crnlib::utils::copy_dwords(uint32 *pDst,uint32 *pSrc,uint num,bool endian_switch)

{
  uint uVar1;
  undefined7 in_register_00000009;
  long lVar2;
  
  if ((int)CONCAT71(in_register_00000009,endian_switch) != 0) {
    if (num != 0) {
      lVar2 = 0;
      do {
        uVar1 = *(uint *)((long)pSrc + lVar2);
        *(uint *)((long)pDst + lVar2) =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        lVar2 = lVar2 + 4;
      } while ((ulong)num << 2 != lVar2);
    }
    return;
  }
  memcpy(pDst,pSrc,(ulong)(num << 2));
  return;
}

Assistant:

void copy_dwords(uint32* pDst, const uint32* pSrc, uint num, bool endian_switch)
        {
            if (!endian_switch)
            {
                memcpy(pDst, pSrc, num << 2U);
            }
            else
            {
                uint32* pDst_end = pDst + num;
                while (pDst != pDst_end)
                {
                    *pDst++ = swap32(*pSrc++);
                }
            }
        }